

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

void Abc_NtkRetimeMinAreaUpdateLatches
               (Abc_Ntk_t *pNtk,Vec_Ptr_t *vMinCut,int fForward,int fUseOldNames)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *vNodes;
  uint *__ptr_00;
  void *pvVar11;
  Abc_Obj_t *pAVar12;
  char *pcVar13;
  Abc_Obj_t *pAVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  char *pcVar19;
  char *__assertion;
  ulong uVar20;
  ulong local_a8;
  Abc_Obj_t *local_88;
  ulong local_60;
  Abc_Obj_t *local_50;
  
  if (pNtk->nObjCounts[8] < 0) {
LAB_008d33c3:
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
  }
  pVVar2 = pNtk->vCis;
  pVVar2->nSize = pVVar2->nSize - pNtk->nObjCounts[8];
  if (pNtk->nObjCounts[8] < 0) goto LAB_008d33c3;
  pVVar3 = pNtk->vCos;
  pVVar3->nSize = pVVar3->nSize - pNtk->nObjCounts[8];
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  pNtk->vCos = (Vec_Ptr_t *)0x0;
  __ptr = pNtk->vBoxes;
  pNtk->vBoxes = (Vec_Ptr_t *)0x0;
  pVVar9 = (Vec_Ptr_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  pVVar9->pArray = ppvVar10;
  iVar8 = __ptr->nSize;
  uVar6 = 0;
  if (iVar8 < 1) {
    local_a8 = 100;
    iVar16 = 0;
  }
  else {
    iVar16 = 0;
    local_a8 = 100;
    lVar17 = 0;
    do {
      pvVar11 = __ptr->pArray[lVar17];
      if ((*(uint *)((long)pvVar11 + 0x14) & 0xf) != 8) {
        iVar8 = (int)local_a8;
        if (iVar16 == iVar8) {
          if (iVar8 < 0x10) {
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = 0x10;
            local_a8 = 0x10;
          }
          else {
            local_a8 = (ulong)(uint)(iVar8 * 2);
            if (pVVar9->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(local_a8 * 8);
            }
            else {
              ppvVar10 = (void **)realloc(pVVar9->pArray,local_a8 * 8);
            }
            pVVar9->pArray = ppvVar10;
            pVVar9->nCap = iVar8 * 2;
          }
        }
        else {
          ppvVar10 = pVVar9->pArray;
        }
        lVar15 = (long)iVar16;
        iVar16 = iVar16 + 1;
        pVVar9->nSize = iVar16;
        ppvVar10[lVar15] = pvVar11;
        iVar8 = __ptr->nSize;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < iVar8);
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar10 = (void **)malloc(800);
  vNodes->pArray = ppvVar10;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar11 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar11;
  if (0 < vMinCut->nSize) {
    uVar6 = 0;
    local_60 = 100;
    lVar17 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)vMinCut->pArray[lVar17];
      uVar7 = *(uint *)&pAVar4->field_0x14 & 0xf;
      if ((fForward != 0) && (uVar7 == 2 || uVar7 == 5)) {
        if ((uVar7 != 5) ||
           (local_50 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray],
           (*(uint *)&local_50->field_0x14 & 0xf) != 8)) {
LAB_008d3328:
          __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                        ,0x1b5,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)"
                       );
        }
        pAVar5 = local_50->pNtk;
        local_88 = (Abc_Obj_t *)pAVar5->vObjs->pArray[*(local_50->vFanins).pArray];
        if ((*(uint *)&local_88->field_0x14 & 0xf) != 4) goto LAB_008d3328;
        iVar8 = local_50->Id;
        iVar1 = pAVar5->nTravIds;
        Vec_IntFillExtra(&pAVar5->vTravIds,iVar8 + 1,(int)local_50);
        if ((-1 < (long)iVar8) && (iVar8 < (pAVar5->vTravIds).nSize)) {
          (pAVar5->vTravIds).pArray[iVar8] = iVar1;
          lVar15 = (long)(pAVar4->vFanouts).nSize;
          if (0 < lVar15) {
            lVar18 = 0;
LAB_008d2bae:
            pAVar14 = pAVar4;
            if ((*(byte *)((long)pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanouts).pArray[lVar18]] +
                          0x14) & 0x10) == 0) goto code_r0x008d2bc0;
            pAVar12 = Abc_NtkCreateNodeBuf
                                (pNtk,(Abc_Obj_t *)
                                      local_88->pNtk->vObjs->pArray[*(local_88->vFanins).pArray]);
            pcVar13 = Abc_ObjName(pAVar4);
            Abc_ObjAssignName(pAVar12,pcVar13,"_buf");
            Abc_ObjPatchFanin(local_88,(Abc_Obj_t *)
                                       local_88->pNtk->vObjs->pArray[*(local_88->vFanins).pArray],
                              pAVar12);
            uVar7 = (uint)local_60;
            if (uVar6 == uVar7) {
              if ((int)uVar7 < 0x10) {
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar11 = malloc(0x80);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr_00 + 2),0x80);
                }
                *(void **)(__ptr_00 + 2) = pvVar11;
                *__ptr_00 = 0x10;
                local_60 = 0x10;
              }
              else {
                local_60 = (ulong)(uVar7 * 2);
                if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                  pvVar11 = malloc(local_60 * 8);
                }
                else {
                  pvVar11 = realloc(*(void **)(__ptr_00 + 2),local_60 * 8);
                }
                *(void **)(__ptr_00 + 2) = pvVar11;
                *__ptr_00 = uVar7 * 2;
              }
            }
            else {
              pvVar11 = *(void **)(__ptr_00 + 2);
            }
            __ptr_00[1] = uVar6 + 1;
            *(Abc_Obj_t **)((long)pvVar11 + (long)(int)uVar6 * 8) = pAVar12;
            Abc_NodeCollectFanouts(pAVar4,vNodes);
            iVar8 = vNodes->nSize;
            if (0 < iVar8) {
              lVar15 = 0;
              do {
                if ((((Abc_Obj_t *)vNodes->pArray[lVar15])->field_0x14 & 0x10) != 0) {
                  Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar15],pAVar4,pAVar12);
                  iVar8 = vNodes->nSize;
                }
                lVar15 = lVar15 + 1;
              } while (lVar15 < iVar8);
            }
            uVar6 = uVar6 + 1;
            if ((pAVar4->vFanouts).nSize < 1) goto LAB_008d3366;
            goto LAB_008d2f9d;
          }
LAB_008d3366:
          __assertion = "Abc_ObjFanoutNum(pObj) > 0";
          pcVar19 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
          ;
          pcVar13 = "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)";
          goto LAB_008d337b;
        }
LAB_008d3311:
        __assertion = "i >= 0 && i < p->nSize";
        pcVar19 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h";
        pcVar13 = "void Vec_IntWriteEntry(Vec_Int_t *, int, int)";
LAB_008d337b:
        __assert_fail(__assertion,pcVar19,0x1cb,pcVar13);
      }
      if ((fForward == 0) && (0xfffffffd < uVar7 - 5)) {
        local_50 = (Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanouts).pArray];
        pAVar5 = local_50->pNtk;
        ppvVar10 = pAVar5->vObjs->pArray;
        pAVar14 = (Abc_Obj_t *)ppvVar10[*(local_50->vFanouts).pArray];
        if ((((*(uint *)&pAVar14->field_0x14 & 0xf) != 5) || (uVar7 != 4)) ||
           ((*(uint *)&local_50->field_0x14 & 0xf) != 8)) {
          __assert_fail("Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                        ,0x1d4,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)"
                       );
        }
        iVar8 = local_50->Id;
        iVar1 = pAVar5->nTravIds;
        Vec_IntFillExtra(&pAVar5->vTravIds,iVar8 + 1,(int)ppvVar10);
        if (((long)iVar8 < 0) || ((pAVar5->vTravIds).nSize <= iVar8)) goto LAB_008d3311;
        (pAVar5->vTravIds).pArray[iVar8] = iVar1;
        local_88 = pAVar4;
        if ((*(byte *)((long)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray] + 0x14) & 0x10)
            != 0) {
          __assert_fail("!Abc_ObjFanin0(pLatchIn)->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                        ,0x1d7,
                        "void Abc_NtkRetimeMinAreaUpdateLatches(Abc_Ntk_t *, Vec_Ptr_t *, int, int)"
                       );
        }
      }
      else {
        pAVar14 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
        local_50 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
        local_88 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
        if (fUseOldNames == 0) {
          pcVar13 = Abc_ObjName(pAVar4);
          Abc_ObjAssignName(pAVar14,pcVar13,"_o1");
          pcVar13 = Abc_ObjName(pAVar4);
          pcVar19 = "_i1";
        }
        else {
          pcVar13 = Abc_ObjName(local_50);
          Abc_ObjAssignName(pAVar14,pcVar13,"_out");
          pcVar13 = Abc_ObjName(local_50);
          pcVar19 = "_in";
        }
        Abc_ObjAssignName(local_88,pcVar13,pcVar19);
        Abc_ObjAddFanin(pAVar14,local_50);
        Abc_ObjAddFanin(local_50,local_88);
        if (fForward == 0) {
          Abc_NodeCollectFanouts(pAVar4,vNodes);
          iVar8 = vNodes->nSize;
          if (0 < iVar8) {
            lVar15 = 0;
            do {
              if ((((Abc_Obj_t *)vNodes->pArray[lVar15])->field_0x14 & 0x10) != 0) {
                Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar15],pAVar4,pAVar14);
                iVar8 = vNodes->nSize;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < iVar8);
          }
        }
        else {
          (local_50->field_5).pData = (void *)(2 - (ulong)((pAVar4->field_6).pTemp == (void *)0x0));
          Abc_NodeCollectFanouts(pAVar4,vNodes);
          iVar8 = vNodes->nSize;
          if (0 < iVar8) {
            lVar15 = 0;
            do {
              if ((((Abc_Obj_t *)vNodes->pArray[lVar15])->field_0x14 & 0x10) == 0) {
                Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[lVar15],pAVar4,pAVar14);
                iVar8 = vNodes->nSize;
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 < iVar8);
          }
        }
        Abc_ObjAddFanin(local_88,pAVar4);
      }
LAB_008d2f9d:
      uVar7 = pVVar2->nSize;
      if (uVar7 == pVVar2->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar10;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar2->pArray,(ulong)uVar7 << 4);
          }
          pVVar2->pArray = ppvVar10;
          pVVar2->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar10 = pVVar2->pArray;
      }
      iVar8 = pVVar2->nSize;
      pVVar2->nSize = iVar8 + 1;
      ppvVar10[iVar8] = pAVar14;
      iVar8 = (int)local_a8;
      if (iVar16 == iVar8) {
        if (iVar8 < 0x10) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,0x80);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = 0x10;
          local_a8 = 0x10;
        }
        else {
          local_a8 = (ulong)(uint)(iVar8 * 2);
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(local_a8 * 8);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar9->pArray,local_a8 * 8);
          }
          pVVar9->pArray = ppvVar10;
          pVVar9->nCap = iVar8 * 2;
        }
      }
      else {
        ppvVar10 = pVVar9->pArray;
      }
      pVVar9->nSize = iVar16 + 1;
      ppvVar10[iVar16] = local_50;
      uVar7 = pVVar3->nSize;
      if (uVar7 == pVVar3->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar10;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(pVVar3->pArray,(ulong)uVar7 << 4);
          }
          pVVar3->pArray = ppvVar10;
          pVVar3->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar10 = pVVar3->pArray;
      }
      iVar8 = pVVar3->nSize;
      pVVar3->nSize = iVar8 + 1;
      ppvVar10[iVar8] = local_88;
      lVar17 = lVar17 + 1;
      iVar16 = iVar16 + 1;
    } while (lVar17 < vMinCut->nSize);
    ppvVar10 = vNodes->pArray;
  }
  if (ppvVar10 != (void **)0x0) {
    free(ppvVar10);
  }
  free(vNodes);
  pvVar11 = *(void **)(__ptr_00 + 2);
  if ((int)uVar6 < 1) {
    if (pvVar11 == (void *)0x0) goto LAB_008d31e1;
  }
  else {
    uVar20 = 0;
    do {
      pAVar4 = *(Abc_Obj_t **)((long)pvVar11 + uVar20 * 8);
      Abc_ObjTransferFanout
                (pAVar4,(Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
      Abc_NtkDeleteObj(pAVar4);
      uVar20 = uVar20 + 1;
    } while (uVar6 != uVar20);
  }
  free(pvVar11);
LAB_008d31e1:
  free(__ptr_00);
  if (0 < __ptr->nSize) {
    lVar17 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)__ptr->pArray[lVar17];
      if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 8) {
        pAVar5 = pAVar4->pNtk;
        iVar8 = pAVar4->Id;
        Vec_IntFillExtra(&pAVar5->vTravIds,iVar8 + 1,(int)pVVar3);
        if (((long)iVar8 < 0) || ((pAVar5->vTravIds).nSize <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((pAVar5->vTravIds).pArray[iVar8] != pAVar4->pNtk->nTravIds) {
          ppvVar10 = pAVar4->pNtk->vObjs->pArray;
          pAVar14 = (Abc_Obj_t *)ppvVar10[*(pAVar4->vFanouts).pArray];
          pAVar12 = (Abc_Obj_t *)ppvVar10[*(pAVar4->vFanins).pArray];
          if (0 < (pAVar14->vFanouts).nSize) {
            Abc_ObjTransferFanout
                      (pAVar14,(Abc_Obj_t *)pAVar12->pNtk->vObjs->pArray[*(pAVar12->vFanins).pArray]
                      );
          }
          Abc_NtkDeleteObj(pAVar14);
          Abc_NtkDeleteObj(pAVar4);
          Abc_NtkDeleteObj(pAVar12);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < __ptr->nSize);
  }
  pNtk->vCis = pVVar2;
  pNtk->vCos = pVVar3;
  pNtk->vBoxes = pVVar9;
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
code_r0x008d2bc0:
  lVar18 = lVar18 + 1;
  if (lVar15 == lVar18) goto LAB_008d2f9d;
  goto LAB_008d2bae;
}

Assistant:

void Abc_NtkRetimeMinAreaUpdateLatches( Abc_Ntk_t * pNtk, Vec_Ptr_t * vMinCut, int fForward, int fUseOldNames )
{
    Vec_Ptr_t * vCis, * vCos, * vBoxes, * vBoxesNew, * vNodes, * vBuffers;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut, * pNext, * pBuffer;
    int i, k;
    // create new latches
    Vec_PtrShrink( pNtk->vCis, Abc_NtkCiNum(pNtk) - Abc_NtkLatchNum(pNtk) );
    Vec_PtrShrink( pNtk->vCos, Abc_NtkCoNum(pNtk) - Abc_NtkLatchNum(pNtk) );
    vCis   = pNtk->vCis;   pNtk->vCis   = NULL;  
    vCos   = pNtk->vCos;   pNtk->vCos   = NULL;  
    vBoxes = pNtk->vBoxes; pNtk->vBoxes = NULL; 
    // transfer boxes
    vBoxesNew = Vec_PtrAlloc(100);
    Vec_PtrForEachEntry( Abc_Obj_t *, vBoxes, pObj, i )
        if ( !Abc_ObjIsLatch(pObj) )
            Vec_PtrPush( vBoxesNew, pObj );
    // create or reuse latches
    vNodes = Vec_PtrAlloc( 100 );
    vBuffers = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vMinCut, pObj, i )
    {
        if ( Abc_ObjIsCi(pObj) && fForward )
        {
            pLatchOut = pObj;
            pLatch    = Abc_ObjFanin0(pLatchOut);
            pLatchIn  = Abc_ObjFanin0(pLatch);
            assert( Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn) );
            // mark the latch as reused
            Abc_NodeSetTravIdCurrent( pLatch );

            // check if there are marked fanouts
            // (these are fanouts to be connected to the latch input)
            Abc_ObjForEachFanout( pObj, pNext, k )
                if ( pNext->fMarkA )
                    break;
            if ( k < Abc_ObjFanoutNum(pObj) )
            {
                // add the buffer
                pBuffer = Abc_NtkCreateNodeBuf( pNtk, Abc_ObjFanin0(pLatchIn) );
                Abc_ObjAssignName( pBuffer, Abc_ObjName(pObj), "_buf" );
                Abc_ObjPatchFanin( pLatchIn, Abc_ObjFanin0(pLatchIn), pBuffer );
                Vec_PtrPush( vBuffers, pBuffer );
                // redirect edges to the unvisited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pBuffer );
            }
            assert( Abc_ObjFanoutNum(pObj) > 0 );
//            if ( Abc_ObjFanoutNum(pObj) == 0 )
//                Abc_NtkDeleteObj_rec( pObj, 0 );
        }
        else if ( Abc_ObjIsCo(pObj) && !fForward )
        {
            pLatchIn  = pObj;
            pLatch    = Abc_ObjFanout0(pLatchIn);
            pLatchOut = Abc_ObjFanout0(pLatch);
            assert( Abc_ObjIsBo(pLatchOut) && Abc_ObjIsLatch(pLatch) && Abc_ObjIsBi(pLatchIn) );
            // mark the latch as reused
            Abc_NodeSetTravIdCurrent( pLatch );
            assert( !Abc_ObjFanin0(pLatchIn)->fMarkA );
        }
        else
        {
            pLatchOut = Abc_NtkCreateBo(pNtk);
            pLatch    = Abc_NtkCreateLatch(pNtk);
            pLatchIn  = Abc_NtkCreateBi(pNtk);

            if ( fUseOldNames )
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
            }
            else
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pObj), "_o1" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pObj), "_i1" );
            }
            // connect
            Abc_ObjAddFanin( pLatchOut, pLatch );
            Abc_ObjAddFanin( pLatch, pLatchIn );
            if ( fForward )
            {
                pLatch->pData = (void *)(ABC_PTRUINT_T)(pObj->pCopy? ABC_INIT_ONE : ABC_INIT_ZERO);
                // redirect edges to the unvisited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( !pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pLatchOut );
            }
            else
            {
                // redirect edges to the visited fanouts of the node
                Abc_NodeCollectFanouts( pObj, vNodes );
                Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNext, k )
                    if ( pNext->fMarkA )
                        Abc_ObjPatchFanin( pNext, pObj, pLatchOut );
            }
            // connect latch to the node
            Abc_ObjAddFanin( pLatchIn, pObj );
        }
        Vec_PtrPush( vCis, pLatchOut );
        Vec_PtrPush( vBoxesNew, pLatch );
        Vec_PtrPush( vCos, pLatchIn );
    }
    Vec_PtrFree( vNodes );
    // remove buffers
    Vec_PtrForEachEntry( Abc_Obj_t *, vBuffers, pObj, i )
    {
        Abc_ObjTransferFanout( pObj, Abc_ObjFanin0(pObj) );
        Abc_NtkDeleteObj( pObj );
    }
    Vec_PtrFree( vBuffers );
    // remove useless latches
    Vec_PtrForEachEntry( Abc_Obj_t *, vBoxes, pObj, i )
    {
        if ( !Abc_ObjIsLatch(pObj) )
            continue;
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        pLatchOut = Abc_ObjFanout0(pObj);
        pLatch    = pObj;
        pLatchIn  = Abc_ObjFanin0(pObj);
        if ( Abc_ObjFanoutNum(pLatchOut) > 0 )
            Abc_ObjTransferFanout( pLatchOut, Abc_ObjFanin0(pLatchIn) );
        Abc_NtkDeleteObj( pLatchOut );
        Abc_NtkDeleteObj( pObj );
        Abc_NtkDeleteObj( pLatchIn );
    }
    // set the arrays
    pNtk->vCis = vCis;
    pNtk->vCos = vCos;
    pNtk->vBoxes = vBoxesNew;
    Vec_PtrFree( vBoxes );
}